

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall
node::anon_unknown_2::ChainImpl::findAncestorByHash
          (ChainImpl *this,uint256 *block_hash,uint256 *ancestor_hash,FoundBlock *ancestor_out)

{
  bool bVar1;
  ChainstateManager *pCVar2;
  CBlockIndex *pCVar3;
  CBlockIndex *index;
  Chainstate *pCVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> lock;
  unique_lock<std::recursive_mutex> uStack_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_38,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
             ,0x266,false);
  pCVar2 = chainman(this);
  pCVar3 = BlockManager::LookupBlockIndex(&pCVar2->m_blockman,block_hash);
  pCVar2 = chainman(this);
  index = BlockManager::LookupBlockIndex(&pCVar2->m_blockman,ancestor_hash);
  if (index != (CBlockIndex *)0x0 && pCVar3 != (CBlockIndex *)0x0) {
    pCVar3 = CBlockIndex::GetAncestor(pCVar3,index->nHeight);
    if (pCVar3 != index) {
      index = (CBlockIndex *)0x0;
    }
  }
  pCVar2 = chainman(this);
  pCVar4 = ChainstateManager::ActiveChainstate(pCVar2);
  pCVar2 = chainman(this);
  bVar1 = FillBlock(index,ancestor_out,
                    (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_38,&pCVar4->m_chain
                    ,&pCVar2->m_blockman);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool findAncestorByHash(const uint256& block_hash, const uint256& ancestor_hash, const FoundBlock& ancestor_out) override
    {
        WAIT_LOCK(cs_main, lock);
        const CBlockIndex* block = chainman().m_blockman.LookupBlockIndex(block_hash);
        const CBlockIndex* ancestor = chainman().m_blockman.LookupBlockIndex(ancestor_hash);
        if (block && ancestor && block->GetAncestor(ancestor->nHeight) != ancestor) ancestor = nullptr;
        return FillBlock(ancestor, ancestor_out, lock, chainman().ActiveChain(), chainman().m_blockman);
    }